

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O3

int dlep_writer_add_status(dlep_writer *writer,dlep_status status,char *text)

{
  size_t sVar1;
  int iVar2;
  uint8_t value;
  undefined1 local_11;
  
  sVar1 = strlen(text);
  iVar2 = -1;
  if (sVar1 < 0xffff) {
    dlep_writer_add_tlv2(writer,1,&local_11,1,text,(uint16_t)sVar1);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
dlep_writer_add_status(struct dlep_writer *writer, enum dlep_status status, const char *text) {
  uint8_t value;
  size_t txtlen;

  value = status;
  txtlen = strlen(text);
  if (txtlen > 65534) {
    return -1;
  }

  dlep_writer_add_tlv2(writer, DLEP_STATUS_TLV, &value, sizeof(value), text, txtlen);
  return 0;
}